

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O2

void __thiscall chrono::ChForce::UpdateState(ChForce *this)

{
  ChMatrix33<double> *this_00;
  ChVector<double> *pCVar1;
  ChBody *this_01;
  element_type *peVar2;
  undefined1 auVar3 [16];
  undefined1 *puVar4;
  undefined1 auVar5 [16];
  ChVector<double> *v;
  PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *this_02;
  VectorBlock<Eigen::Matrix<double,_7,_1,_0,_7,_1>,__1> *this_03;
  double dVar6;
  undefined8 uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChGlMatrix34<double> mGl;
  ChVectorN<double,_4> Qfrot;
  ChVector<double> VQtemp;
  ChVectorN<double,_4> Qfrot_1;
  undefined1 local_1f0 [16];
  double local_1e0;
  undefined1 local_1c0 [16];
  double local_1b0;
  double local_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  ChGlMatrix34<double> local_180;
  undefined1 local_120 [64];
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  XprTypeNested local_b0;
  variable_if_dynamic<long,__1> local_a8;
  ulong local_a0;
  ulong uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> local_80 [80];
  
  local_1b0 = 0.0;
  local_1c0 = ZEXT816(0);
  this_01 = this->Body;
  peVar2 = (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1f0._8_8_ = 0;
  local_1f0._0_8_ = DAT_011dd3e0;
  local_1e0 = DAT_011dd3e8;
  if (peVar2 == (element_type *)0x0) {
    uVar7 = 0;
    dVar6 = VNULL;
  }
  else {
    dVar6 = (this->super_ChObj).ChTime;
    uVar7 = 0;
    (*peVar2->_vptr_ChFunction[4])();
  }
  peVar2 = (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    local_1f0._0_8_ = (this->super_ChObj).ChTime;
    local_1f0._8_8_ = 0;
    (*peVar2->_vptr_ChFunction[4])();
  }
  peVar2 = (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    local_1e0 = (this->super_ChObj).ChTime;
    (*peVar2->_vptr_ChFunction[4])();
  }
  if (this->frame == BODY) {
    auVar3._8_8_ = uVar7;
    auVar3._0_8_ = dVar6;
    auVar3 = vunpcklpd_avx(auVar3,local_1f0);
    dVar6 = (this->restpos).m_data[2];
    dVar8 = (this->restpos).m_data[1];
    (this->vrelpoint).m_data[0] = auVar3._0_8_ + (this->restpos).m_data[0];
    (this->vrelpoint).m_data[1] = auVar3._8_8_ + dVar8;
    (this->vrelpoint).m_data[2] = local_1e0 + dVar6;
    ChBody::Point_Body2World((ChVector<double> *)&local_180,this_01,&this->vrelpoint);
    if (&local_180 != (ChGlMatrix34<double> *)&this->vpoint) {
      (this->vpoint).m_data[0] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
      (this->vpoint).m_data[1] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
      (this->vpoint).m_data[2] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    }
  }
  else if (this->frame == WORLD) {
    auVar5._8_8_ = uVar7;
    auVar5._0_8_ = dVar6;
    auVar3 = vunpcklpd_avx(auVar5,local_1f0);
    dVar6 = (this->restpos).m_data[2];
    dVar8 = (this->restpos).m_data[1];
    (this->vpoint).m_data[0] = auVar3._0_8_ + (this->restpos).m_data[0];
    (this->vpoint).m_data[1] = auVar3._8_8_ + dVar8;
    (this->vpoint).m_data[2] = local_1e0 + dVar6;
    ChBody::Point_World2Body((ChVector<double> *)&local_180,this_01,&this->vpoint);
    if (&local_180 != (ChGlMatrix34<double> *)&this->vrelpoint) {
      (this->vrelpoint).m_data[0] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
      (this->vrelpoint).m_data[1] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
      (this->vrelpoint).m_data[2] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    }
  }
  dVar6 = this->mforce;
  dVar8 = (this->super_ChObj).ChTime;
  (*((this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  dVar9 = DAT_011dd3e8;
  auVar11._8_8_ = (double)DAT_011dd3e0;
  auVar11._0_8_ = VNULL;
  local_1b0 = DAT_011dd3e8;
  peVar2 = (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c0 = auVar11;
  local_1a8 = dVar8;
  local_190 = auVar11;
  if (peVar2 != (element_type *)0x0) {
    dVar8 = (this->super_ChObj).ChTime;
    uVar7 = 0;
    (*peVar2->_vptr_ChFunction[4])();
    local_190._8_8_ = uVar7;
    local_190._0_8_ = dVar8;
    local_1c0._0_8_ = dVar8;
  }
  peVar2 = (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_1a0 = vshufpd_avx(auVar11,auVar11,1);
  }
  else {
    dVar8 = (this->super_ChObj).ChTime;
    uVar7 = 0;
    (*peVar2->_vptr_ChFunction[4])();
    local_1a0._8_8_ = uVar7;
    local_1a0._0_8_ = dVar8;
    local_1c0._8_8_ = dVar8;
  }
  peVar2 = (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar8 = dVar9;
  if (peVar2 != (element_type *)0x0) {
    dVar8 = (this->super_ChObj).ChTime;
    (*peVar2->_vptr_ChFunction[4])();
    local_1b0 = dVar8;
  }
  dVar6 = local_1a8 * dVar6;
  if (this->align == BODY_DIR) {
    this_00 = &(this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
               Amatrix;
    ChMatrix33<double>::operator*(this_00,&this->vreldir);
    if (&local_180 == (ChGlMatrix34<double> *)&this->vdir) {
      puVar4 = (undefined1 *)(this->vdir).m_data[0];
      dVar9 = (this->vdir).m_data[1];
      dVar8 = (this->vdir).m_data[2];
    }
    else {
      (this->vdir).m_data[0] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
      (this->vdir).m_data[1] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
      (this->vdir).m_data[2] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
      dVar8 = local_180.super_ChMatrix34<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2]
      ;
      puVar4 = (undefined1 *)
               local_180.super_ChMatrix34<double>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
               [0];
      dVar9 = local_180.super_ChMatrix34<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1]
      ;
    }
    ChMatrix33<double>::operator*(this_00,(ChVector<double> *)local_1c0);
    auVar11._0_8_ =
         local_180.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] +
         dVar6 * (double)puVar4;
    auVar11._8_8_ =
         local_180.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] +
         dVar6 * dVar9;
    dVar9 = local_180.super_ChMatrix34<double>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] +
            dVar6 * dVar8;
    local_1c0._8_8_ =
         local_180.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_1c0._0_8_ =
         local_180.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_1b0 = local_180.super_ChMatrix34<double>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array
                [2];
  }
  else if (this->align == WORLD_DIR) {
    ChFrame<double>::TransformDirectionParentToLocal
              ((ChVector<double> *)&local_180,(ChFrame<double> *)&this_01->super_ChBodyFrame,
               &this->vdir);
    if (&local_180 != (ChGlMatrix34<double> *)&this->vreldir) {
      (this->vreldir).m_data[0] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
      (this->vreldir).m_data[1] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
      (this->vreldir).m_data[2] =
           local_180.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    }
    dVar9 = dVar6 * (this->vdir).m_data[2] + dVar8;
    auVar3 = vunpcklpd_avx(local_190,local_1a0);
    auVar11._0_8_ = dVar6 * (this->vdir).m_data[0] + auVar3._0_8_;
    auVar11._8_8_ = dVar6 * (this->vdir).m_data[1] + auVar3._8_8_;
  }
  *(undefined1 (*) [16])(this->force).m_data = auVar11;
  (this->force).m_data[2] = dVar9;
  ChFrame<double>::TransformDirectionParentToLocal
            ((ChVector<double> *)&local_180,(ChFrame<double> *)&this_01->super_ChBodyFrame,
             &this->force);
  local_c8._8_8_ = &this->relforce;
  if (&local_180 != (ChGlMatrix34<double> *)local_c8._8_8_) {
    (this->relforce).m_data[0] =
         local_180.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    (this->relforce).m_data[1] =
         local_180.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    (this->relforce).m_data[2] =
         local_180.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  }
  if (this->mode == TORQUE) {
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [2] = 0.0;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [0] = 0.0;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [1] = 0.0;
    ChGlMatrix34<double>::ChGlMatrix34
              (&local_180,
               &(this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord
                .rot);
    this_02 = (PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)local_120;
    local_c8._0_8_ = &local_180;
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,0>>
              (this_02,(DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)local_c8);
    this_03 = (VectorBlock<Eigen::Matrix<double,_7,_1,_0,_7,_1>,__1> *)local_c8;
  }
  else {
    if (this->mode != FORCE) {
      return;
    }
    dVar6 = (this->force).m_data[1];
    local_180.super_ChMatrix34<double>.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.
    m_storage.m_data.array[0] = (double)local_c8;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [0] = (this->force).m_data[0];
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [1] = dVar6;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [2] = (this->force).m_data[2];
    local_c8._0_8_ = (ChGlMatrix34<double> *)0x0;
    local_b0 = (XprTypeNested)(this->vrelpoint).m_data[2];
    auVar10._0_8_ = -(double)local_b0;
    auVar10._8_8_ = 0x8000000000000000;
    pCVar1 = (ChVector<double> *)vmovlpd_avx(auVar10);
    local_a8.m_value = 0;
    auVar3 = *(undefined1 (*) [16])(this->vrelpoint).m_data;
    local_c8._16_8_ = (this->vrelpoint).m_data[1];
    local_a0 = auVar3._0_8_ ^ 0x8000000000000000;
    uStack_98 = auVar3._8_8_ ^ 0x8000000000000000;
    local_90 = vmovlpd_avx(auVar3);
    local_88 = 0;
    v = (ChVector<double> *)local_c8._8_8_;
    local_c8._8_8_ = pCVar1;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_180,v);
    ChGlMatrix34<double>::ChGlMatrix34
              (&local_180,
               &(this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord
                .rot);
    this_02 = local_80;
    local_120._0_8_ = &local_180;
    local_120._16_8_ = local_e0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>const>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,0>>
              (this_02,(DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)local_120);
    this_03 = (VectorBlock<Eigen::Matrix<double,_7,_1,_0,_7,_1>,__1> *)local_120;
  }
  Eigen::VectorBlock<Eigen::Matrix<double,_7,_1,_0,_7,_1>,_-1>::VectorBlock(this_03,&this->Qf,3,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,1,0,7,1>,_1,1,false>,Eigen::Matrix<double,4,1,0,4,1>>
            (&this_03->super_Block<Eigen::Matrix<double,_7,_1,_0,_7,_1>,__1,_1,_false>,
             (Matrix<double,_4,_1,_0,_4,_1> *)this_02);
  return;
}

Assistant:

void ChForce::UpdateState() {
    ChBody* my_body;
    double modforce;
    ChVector<> vectforce;
    ChVector<> vmotion;
    ChVector<> xyzforce;

    my_body = GetBody();

    // ====== Update the position of point of application

    vmotion = VNULL;
    if (move_x)
        vmotion.x() = move_x->Get_y(ChTime);
    if (move_y)
        vmotion.y() = move_y->Get_y(ChTime);
    if (move_z)
        vmotion.z() = move_z->Get_y(ChTime);

    switch (frame) {
        case WORLD:
            vpoint = Vadd(restpos, vmotion);                // Uw
            vrelpoint = my_body->Point_World2Body(vpoint);  // Uo1 = [A]'(Uw-Xo1)
            break;
        case BODY:
            vrelpoint = Vadd(restpos, vmotion);             // Uo1
            vpoint = my_body->Point_Body2World(vrelpoint);  // Uw = Xo1+[A]Uo1
            break;
    }

    // ====== Update the fm force vector and add fv

    modforce = mforce * modula->Get_y(ChTime);

    vectforce = VNULL;
    xyzforce = VNULL;
    if (f_x)
        xyzforce.x() = f_x->Get_y(ChTime);
    if (f_y)
        xyzforce.y() = f_y->Get_y(ChTime);
    if (f_z)
        xyzforce.z() = f_z->Get_y(ChTime);

    switch (align) {
        case WORLD_DIR:
            vreldir = my_body->TransformDirectionParentToLocal(vdir);
            vectforce = Vmul(vdir, modforce);
            vectforce = Vadd(vectforce, xyzforce);
            break;
        case BODY_DIR:
            vdir = my_body->TransformDirectionLocalToParent(vreldir);
            vectforce = Vmul(vdir, modforce);
            xyzforce = my_body->TransformDirectionLocalToParent(xyzforce);
            vectforce = Vadd(vectforce, xyzforce);
            break;
    }

    force = vectforce;                                           // Fw
    relforce = my_body->TransformDirectionParentToLocal(force);  // Fo1 = [A]'Fw

    // ====== Update the Qc lagrangian!

    switch (mode) {
        case FORCE: {
            Qf(0) = force.x();  // pos.lagrangian Qfx
            Qf(1) = force.y();
            Qf(2) = force.z();

            //   Qfrot= (-[A][u][G])'f

            ChStarMatrix33<> Xpos(vrelpoint);
            ChVector<> VQtemp = Xpos.transpose() * relforce; // = [u]'[A]'F,w

            ChGlMatrix34<> mGl(my_body->GetCoord().rot);
            ChVectorN<double, 4> Qfrot = -mGl.transpose() * VQtemp.eigen(); // Q = - [Gl]'[u]'[A]'F,w

            Qf.segment(3, 4) = Qfrot;

            break;
        }

        case TORQUE:
            Qf(0) = 0;  // pos.lagrangian Qfx
            Qf(1) = 0;
            Qf(2) = 0;

            // rot.lagangian
            ChGlMatrix34<> mGl(my_body->GetCoord().rot);
            ChVectorN<double, 4> Qfrot = mGl.transpose() * relforce.eigen();

            Qf.segment(3, 4) = Qfrot;

            break;
    }
}